

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall
sglr::ReferenceContextLimits::ReferenceContextLimits
          (ReferenceContextLimits *this,RenderContext *renderCtx)

{
  ContextType CVar1;
  bool bVar2;
  deUint32 dVar3;
  int iVar4;
  ApiType AVar5;
  undefined4 extraout_var;
  Functions *gl;
  RenderContext *renderCtx_local;
  ReferenceContextLimits *this_local;
  long lVar6;
  
  dVar3 = (*renderCtx->_vptr_RenderContext[2])();
  (this->contextType).super_ApiType.m_bits = dVar3;
  this->maxTextureImageUnits = 0;
  this->maxTexture2DSize = 0;
  this->maxTextureCubeSize = 0;
  this->maxTexture2DArrayLayers = 0;
  this->maxTexture3DSize = 0;
  this->maxRenderbufferSize = 0;
  this->maxVertexAttribs = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->extensionList);
  std::__cxx11::string::string((string *)&this->extensionStr);
  iVar4 = (*renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar4);
  (**(code **)(lVar6 + 0x868))(0x8872,&this->maxTextureImageUnits);
  (**(code **)(lVar6 + 0x868))(0xd33,&this->maxTexture2DSize);
  (**(code **)(lVar6 + 0x868))(0x851c,&this->maxTextureCubeSize);
  (**(code **)(lVar6 + 0x868))(0x84e8,&this->maxRenderbufferSize);
  (**(code **)(lVar6 + 0x868))(0x8869);
  CVar1.super_ApiType.m_bits = (ApiType)(this->contextType).super_ApiType.m_bits;
  AVar5 = glu::ApiType::es(3,0);
  bVar2 = glu::contextSupports(CVar1,AVar5);
  if ((bVar2) ||
     (bVar2 = glu::isContextTypeGLCore((ContextType)(this->contextType).super_ApiType.m_bits), bVar2
     )) {
    (**(code **)(lVar6 + 0x868))(0x88ff,&this->maxTexture2DArrayLayers);
    (**(code **)(lVar6 + 0x868))(0x8073,&this->maxTexture3DSize);
  }
  iVar4 = de::min<int>(this->maxTexture2DSize,0x4000);
  this->maxTexture2DSize = iVar4;
  iVar4 = de::min<int>(this->maxTextureCubeSize,0x4000);
  this->maxTextureCubeSize = iVar4;
  iVar4 = de::min<int>(this->maxTexture3DSize,0x4000);
  this->maxTexture3DSize = iVar4;
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,(char *)0x0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
                  ,0x10b);
  addExtension(this,"GL_EXT_color_buffer_half_float");
  addExtension(this,"GL_EXT_color_buffer_float");
  CVar1.super_ApiType.m_bits = (ApiType)(this->contextType).super_ApiType.m_bits;
  AVar5 = glu::ApiType::es(3,1);
  bVar2 = glu::contextSupports(CVar1,AVar5);
  if (bVar2) {
    addExtension(this,"GL_EXT_texture_cube_map_array");
  }
  return;
}

Assistant:

ReferenceContextLimits::ReferenceContextLimits (const glu::RenderContext& renderCtx)
	: contextType				(renderCtx.getType())
	, maxTextureImageUnits		(0)
	, maxTexture2DSize			(0)
	, maxTextureCubeSize		(0)
	, maxTexture2DArrayLayers	(0)
	, maxTexture3DSize			(0)
	, maxRenderbufferSize		(0)
	, maxVertexAttribs			(0)
{
	const glw::Functions& gl = renderCtx.getFunctions();

	gl.getIntegerv(GL_MAX_TEXTURE_IMAGE_UNITS,		&maxTextureImageUnits);
	gl.getIntegerv(GL_MAX_TEXTURE_SIZE,				&maxTexture2DSize);
	gl.getIntegerv(GL_MAX_CUBE_MAP_TEXTURE_SIZE,	&maxTextureCubeSize);
	gl.getIntegerv(GL_MAX_RENDERBUFFER_SIZE,		&maxRenderbufferSize);
	gl.getIntegerv(GL_MAX_VERTEX_ATTRIBS,			&maxVertexAttribs);

	if (contextSupports(contextType, glu::ApiType::es(3,0)) || glu::isContextTypeGLCore(contextType))
	{
		gl.getIntegerv(GL_MAX_ARRAY_TEXTURE_LAYERS,	&maxTexture2DArrayLayers);
		gl.getIntegerv(GL_MAX_3D_TEXTURE_SIZE,		&maxTexture3DSize);
	}

	// Limit texture sizes to supported values
	maxTexture2DSize	= de::min(maxTexture2DSize,		(int)MAX_TEXTURE_SIZE);
	maxTextureCubeSize	= de::min(maxTextureCubeSize,	(int)MAX_TEXTURE_SIZE);
	maxTexture3DSize	= de::min(maxTexture3DSize,		(int)MAX_TEXTURE_SIZE);

	GLU_EXPECT_NO_ERROR(gl.getError(), GL_NO_ERROR);

	// \todo [pyry] Figure out following things:
	// + supported fbo configurations
	// ...

	// \todo [2013-08-01 pyry] Do we want to make these conditional based on renderCtx?
	addExtension("GL_EXT_color_buffer_half_float");
	addExtension("GL_EXT_color_buffer_float");

	if (contextSupports(contextType, glu::ApiType::es(3,1)))
		addExtension("GL_EXT_texture_cube_map_array");
}